

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O2

bool vkt::image::anon_unknown_0::comparePixelBuffers
               (TestLog *log,Texture *texture,VkFormat format,ConstPixelBufferAccess *reference,
               ConstPixelBufferAccess *result)

{
  bool bVar1;
  _Alloc_hider imageSetName;
  _Alloc_hider imageSetDesc;
  bool bVar2;
  IVec3 *pIVar3;
  uint uVar4;
  int iVar5;
  int local_20c;
  char local_205;
  int local_204;
  int local_200;
  ImageType local_1fc;
  TestLog *local_1f8;
  ConstPixelBufferAccess *local_1f0;
  ConstPixelBufferAccess *local_1e8;
  Vector<float,_4> local_1e0;
  string comparisonName;
  ConstPixelBufferAccess resultLayer;
  ConstPixelBufferAccess refLayer;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string comparisonDesc;
  string local_100;
  string local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  ConstPixelBufferAccess local_80;
  ConstPixelBufferAccess local_58;
  
  local_1f8 = log;
  local_1f0 = result;
  local_1e8 = reference;
  local_205 = isIntegerFormat(format);
  local_1fc = texture->m_type;
  if (local_1fc == IMAGE_TYPE_3D) {
    Texture::size((Texture *)&refLayer);
    pIVar3 = &refLayer.m_size;
  }
  else {
    pIVar3 = (IVec3 *)&texture->m_numLayers;
  }
  local_204 = pIVar3->m_data[0];
  local_20c = 0;
  iVar5 = 0;
  do {
    if (local_204 <= local_20c) {
      return iVar5 == local_204;
    }
    local_200 = iVar5;
    de::toString<int>((string *)&refLayer,&local_20c);
    std::operator+(&comparisonName,"Comparison",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&refLayer);
    std::__cxx11::string::~string((string *)&refLayer);
    uVar4 = texture->m_type - IMAGE_TYPE_CUBE;
    if (uVar4 < 2) {
      resultLayer.m_format.order = local_20c % 6;
      de::toString<int>(&local_c0,(int *)&resultLayer);
      std::operator+(&local_a0,"face ",&local_c0);
      std::operator+(&local_140,&local_a0,", cube ");
      local_1e0.m_data[0] = (float)(local_20c / 6);
      de::toString<int>(&local_e0,(int *)&local_1e0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&refLayer,
                     &local_140,&local_e0);
      bVar1 = false;
LAB_006d564f:
      bVar2 = false;
    }
    else {
      if (local_1fc == IMAGE_TYPE_3D) {
        de::toString<int>(&local_100,&local_20c);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &refLayer,"slice ",&local_100);
        bVar1 = true;
        goto LAB_006d564f;
      }
      de::toString<int>(&local_160,&local_20c);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&refLayer,
                     "layer ",&local_160);
      bVar2 = true;
      bVar1 = false;
    }
    std::operator+(&comparisonDesc,"Image Comparison, ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&refLayer);
    std::__cxx11::string::~string((string *)&refLayer);
    if (bVar2) {
      std::__cxx11::string::~string((string *)&local_160);
    }
    if (bVar1) {
      std::__cxx11::string::~string((string *)&local_100);
    }
    if (uVar4 < 2) {
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_58,local_1e8);
    getLayerOrSlice(&refLayer,texture,&local_58,local_20c);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_80,local_1f0);
    getLayerOrSlice(&resultLayer,texture,&local_80,local_20c);
    imageSetDesc = comparisonDesc._M_dataplus;
    imageSetName = comparisonName._M_dataplus;
    if (local_205 == '\0') {
      tcu::Vector<float,_4>::Vector(&local_1e0,0.01);
      bVar2 = tcu::floatThresholdCompare
                        (local_1f8,imageSetName._M_p,imageSetDesc._M_p,&refLayer,&resultLayer,
                         &local_1e0,COMPARE_LOG_RESULT);
    }
    else {
      tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)&local_1e0,0);
      bVar2 = tcu::intThresholdCompare
                        (local_1f8,imageSetName._M_p,imageSetDesc._M_p,&refLayer,&resultLayer,
                         (UVec4 *)&local_1e0,COMPARE_LOG_RESULT);
    }
    iVar5 = local_200 + (uint)bVar2;
    std::__cxx11::string::~string((string *)&comparisonDesc);
    std::__cxx11::string::~string((string *)&comparisonName);
    local_20c = local_20c + 1;
  } while( true );
}

Assistant:

bool comparePixelBuffers (tcu::TestLog&						log,
						  const Texture&					texture,
						  const VkFormat					format,
						  const tcu::ConstPixelBufferAccess	reference,
						  const tcu::ConstPixelBufferAccess	result)
{
	DE_ASSERT(reference.getFormat() == result.getFormat());
	DE_ASSERT(reference.getSize() == result.getSize());

	const bool intFormat = isIntegerFormat(format);
	const bool is3d = (texture.type() == IMAGE_TYPE_3D);
	const int numLayersOrSlices = (is3d ? texture.size().z() : texture.numLayers());
	const int numCubeFaces = 6;

	int passedLayers = 0;
	for (int layerNdx = 0; layerNdx < numLayersOrSlices; ++layerNdx)
	{
		const std::string comparisonName = "Comparison" + de::toString(layerNdx);
		const std::string comparisonDesc = "Image Comparison, " +
			(isCube(texture) ? "face " + de::toString(layerNdx % numCubeFaces) + ", cube " + de::toString(layerNdx / numCubeFaces) :
			is3d			 ? "slice " + de::toString(layerNdx) : "layer " + de::toString(layerNdx));

		const tcu::ConstPixelBufferAccess refLayer = getLayerOrSlice(texture, reference, layerNdx);
		const tcu::ConstPixelBufferAccess resultLayer = getLayerOrSlice(texture, result, layerNdx);

		bool ok = false;
		if (intFormat)
			ok = tcu::intThresholdCompare(log, comparisonName.c_str(), comparisonDesc.c_str(), refLayer, resultLayer, tcu::UVec4(0), tcu::COMPARE_LOG_RESULT);
		else
			ok = tcu::floatThresholdCompare(log, comparisonName.c_str(), comparisonDesc.c_str(), refLayer, resultLayer, tcu::Vec4(0.01f), tcu::COMPARE_LOG_RESULT);

		if (ok)
			++passedLayers;
	}
	return passedLayers == numLayersOrSlices;
}